

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O2

BigInteger *
BigIntegerLibrary::gcdex
          (BigInteger *__return_storage_ptr__,BigInteger *a,BigInteger *b,BigInteger *x,
          BigInteger *y)

{
  bool bVar1;
  BigInteger x1;
  BigInteger y1;
  BigInteger local_c8;
  BigInteger local_a8;
  BigInteger local_88;
  BigInteger local_68;
  BigInteger local_48;
  
  bVar1 = BigInteger::operator==(a,(BigInteger *)zero);
  if (bVar1) {
    BigInteger::operator=(x,(BigInteger *)zero);
    BigInteger::BigInteger(&x1,1);
    BigInteger::operator=(y,&x1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x1);
    BigInteger::BigInteger(__return_storage_ptr__,b);
  }
  else {
    BigInteger::BigInteger(&x1);
    BigInteger::BigInteger(&y1);
    BigInteger::operator%(&local_48,b,a);
    BigInteger::BigInteger(&local_68,a);
    gcdex(__return_storage_ptr__,&local_48,&local_68,&x1,&y1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
    BigInteger::operator/(&local_c8,b,a);
    BigInteger::operator*(&local_a8,&local_c8,&x1);
    BigInteger::operator-(&local_88,&y1,&local_a8);
    BigInteger::operator=(x,&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
    BigInteger::operator=(y,&x1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&y1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInteger gcdex(BigInteger a, BigInteger b, BigInteger& x, BigInteger& y) {
        if (a == zero) {
            x = zero;
            y = BigInteger(1);
            return b;
        }
        BigInteger x1, y1;
        BigInteger d = gcdex(b % a, a, x1, y1);
        x = y1 - (b / a) * x1;
        y = x1;
        return d;
    }